

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

_Bool regime_using_lpae_format(CPUARMState_conflict *env,ARMMMUIdx mmu_idx)

{
  _Bool _Var1;
  uint32_t el_00;
  int iVar2;
  TCR *pTVar3;
  int el;
  ARMMMUIdx mmu_idx_local;
  CPUARMState_conflict *env_local;
  
  el_00 = regime_el(env,mmu_idx);
  if ((el_00 == 2) || (_Var1 = arm_el_is_aa64(env,el_00), _Var1)) {
    return true;
  }
  iVar2 = arm_feature(env,0x1a);
  if ((iVar2 != 0) && (pTVar3 = regime_tcr(env,mmu_idx), (pTVar3->raw_tcr & 0x80000000) != 0)) {
    return true;
  }
  return false;
}

Assistant:

static inline bool regime_using_lpae_format(CPUARMState *env,
                                            ARMMMUIdx mmu_idx)
{
    int el = regime_el(env, mmu_idx);
    if (el == 2 || arm_el_is_aa64(env, el)) {
        return true;
    }
    if (arm_feature(env, ARM_FEATURE_LPAE)
        && (regime_tcr(env, mmu_idx)->raw_tcr & TTBCR_EAE)) {
        return true;
    }
    return false;
}